

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void sellobj(obj *obj,xchar x,xchar y)

{
  int iVar1;
  obj *poVar2;
  level *lev;
  boolean bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  monst *mtmp;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  char *pcVar22;
  bool bVar23;
  long local_168;
  char qbuf [256];
  
  lev = level;
  poVar2 = obj->cobj;
  cVar4 = obj->oclass;
  pcVar7 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar7);
  if (mtmp == (monst *)0x0) {
    return;
  }
  iVar5 = inhishop(mtmp);
  if (iVar5 == 0) {
    return;
  }
  bVar3 = costly_spot(x,y);
  if (bVar3 == '\0') {
    return;
  }
  if (u.ushops[0] == '\0') {
    return;
  }
  if (((obj->field_0x4a & 4) != 0 && cVar4 != '\f') && poVar2 == (obj *)0x0) {
    sub_one_frombill(obj,mtmp);
    return;
  }
  if (poVar2 == (obj *)0x0) {
    bVar23 = false;
    lVar8 = 0;
    local_168 = 0;
  }
  else {
    local_168 = contained_cost(obj,mtmp,0,'\x01','\0');
    lVar8 = contained_gold(obj);
    bVar23 = 0 < lVar8;
  }
  bVar3 = saleable(mtmp,obj);
  if (cVar4 == '\f') {
    lVar9 = 0;
    bVar21 = true;
  }
  else {
    bVar21 = bVar23;
    if (bVar3 == '\0' || (obj->field_0x4a & 4) != 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = set_cost(obj,mtmp);
    }
  }
  lVar14 = lVar9 + local_168;
  if ((bVar21 == false) && ((lVar14 + lVar8 == 0 || (sell_how == 2)))) {
    bVar23 = (obj->field_0x4a & 4) == 0;
    if (poVar2 != (obj *)0x0 && bVar23) {
      iVar5 = count_unpaid(obj->cobj);
      bVar23 = iVar5 == 0;
    }
    if (poVar2 == (obj *)0x0) {
      obj->field_0x4a = obj->field_0x4a | 8;
    }
    else {
      dropped_container(obj,mtmp,'\0');
      if ((*(uint *)&obj->field_0x4a & 4) == 0) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
      }
      if (((obj->field_0x4a & 4) != 0) || (iVar5 = count_unpaid(obj->cobj), iVar5 != 0)) {
        subfrombill(obj,mtmp);
      }
    }
    if (!(bool)(bVar23 & sell_how != 2)) {
      return;
    }
    pcVar7 = Monnam(mtmp);
    pline("%s seems uninterested.",pcVar7);
    return;
  }
  rouse_shk(mtmp,'\x01');
  if ((mtmp->field_0x62 & 0x40) == 0) {
    pline("Thank you, scum!");
LAB_0023e3e8:
    subfrombill(obj,mtmp);
    return;
  }
  iVar5._0_1_ = mtmp[0x1b].mtame;
  iVar5._1_1_ = mtmp[0x1b].m_ap_type;
  iVar5._2_1_ = mtmp[0x1b].mfrozen;
  iVar5._3_1_ = mtmp[0x1b].mblinded;
  if (iVar5 != 0) {
    if (cVar4 == '\f') {
      lVar14 = (long)obj->quan;
    }
    else {
      lVar14 = lVar14 + (ulong)bVar23;
    }
    mtmp[0x1b].mtame = '\0';
    mtmp[0x1b].m_ap_type = '\0';
    mtmp[0x1b].mfrozen = '\0';
    mtmp[0x1b].mblinded = '\0';
    if (lVar14 != 0) {
      verbalize("Thank you for your contribution to restock this recently plundered shop.");
    }
    goto LAB_0023e3e8;
  }
  if (bVar21 != false) {
    if (bVar23 == false) {
      lVar8 = (long)obj->quan;
    }
    iVar5 = *(int *)&mtmp[0x1b].field_0x60;
    lVar15 = lVar8 - iVar5;
    if (lVar15 == 0 || lVar8 < iVar5) {
      iVar1 = *(int *)&mtmp[0x1b].mfleetim;
      if ((long)iVar1 != 0) {
        iVar18 = 0;
        if (lVar8 <= iVar1) {
          iVar18 = iVar1 - (int)lVar8;
        }
        mtmp[0x1b].mfleetim = (char)iVar18;
        mtmp[0x1b].wormno = (char)((uint)iVar18 >> 8);
        mtmp[0x1b].weapon_check = (char)((uint)iVar18 >> 0x10);
        mtmp[0x1b].field_0x67 = (char)((uint)iVar18 >> 0x18);
      }
      iVar5 = iVar5 - (int)lVar8;
      *(int *)&mtmp[0x1b].field_0x60 = iVar5;
      pcVar7 = "partially ";
      if (iVar5 == 0) {
        pcVar7 = "";
      }
      pline("Your debt is %spaid off.",pcVar7);
    }
    else {
      mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar15;
      if (iVar5 != 0) {
        *(undefined8 *)&mtmp[0x1b].field_0x60 = 0;
        pline("Your debt is paid off.");
      }
      pcVar7 = currency(lVar15);
      pcVar16 = "is";
      if (1 < lVar15) {
        pcVar16 = "are";
      }
      pline("%ld %s %s added to your credit.",lVar15,pcVar7,pcVar16);
    }
    if ((lVar14 == 0) || (sell_how == 2)) {
      if (cVar4 == '\f') {
        return;
      }
      if (poVar2 != (obj *)0x0) {
        dropped_container(obj,mtmp,'\0');
      }
      if ((*(uint *)&obj->field_0x4a & 4) == 0) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
      }
      goto LAB_0023e3e8;
    }
  }
  if ((((((bVar3 == '\0') && (poVar2 == (obj *)0x0 || local_168 < 1)) ||
        (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200)) ||
       ((cVar4 = obj->oclass, cVar4 == '\x0f' || (cVar4 == '\x10')))) ||
      ((lVar14 == 0 || ((cVar4 == '\a' && (obj->oeaten != 0)))))) ||
     (((ushort)(obj->otyp - 0xe5U) < 2 &&
      ((long)obj->age < (long)objects[(ushort)obj->otyp].oc_cost * 0x14)))) {
    pcVar7 = Monnam(mtmp);
    pcVar16 = "";
    if (bVar23 != false) {
      pcVar16 = " in the rest";
    }
    pline("%s seems uninterested%s.",pcVar7,pcVar16);
    if (poVar2 != (obj *)0x0) {
      dropped_container(obj,mtmp,'\0');
    }
    obj->field_0x4a = obj->field_0x4a | 8;
    return;
  }
  lVar8 = money_cnt(mtmp->minvent);
  if (lVar8 == 0) {
    lVar8 = (ulong)(lVar14 < 2) + (lVar14 * 9) / 10;
    if ((sell_how == 0) || ((auto_credit & 1) != 0)) {
      sell_response = 'y';
LAB_0023e86f:
      cVar4 = 'y';
    }
    else {
      cVar4 = 'n';
      if (sell_response != 'n') {
        pcVar7 = Monnam(mtmp);
        pline("%s cannot pay you at present.",pcVar7);
        pcVar7 = currency(lVar8);
        pcVar16 = doname(obj);
        sprintf(qbuf,"Will you accept %ld %s in credit for %s?",lVar8,pcVar7,pcVar16);
        cVar4 = yn_function(qbuf,"ynaq",'y');
        if (cVar4 == 'a') {
          auto_credit = 1;
          goto LAB_0023e86f;
        }
      }
    }
    if (cVar4 == 'q') {
LAB_0023e8c7:
      sell_response = 'n';
LAB_0023e8ce:
      if (poVar2 != (obj *)0x0) {
        dropped_container(obj,mtmp,'\0');
      }
      if ((*(uint *)&obj->field_0x4a & 4) == 0) {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
      }
    }
    else {
      if (cVar4 != 'y') goto LAB_0023e8ce;
      pcVar7 = "You traded %s for %ld zorkmid%s in %scredit.";
      if (sell_how == 0) {
        pcVar7 = "You relinquish %s and acquire %ld zorkmid%s in %scredit.";
      }
      pcVar16 = "";
      if (0 < (int)mtmp[0x1b].mappearance) {
        pcVar16 = "additional ";
      }
      shk_names_obj(mtmp,obj,pcVar7,lVar8,pcVar16);
      mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar8;
    }
    subfrombill(obj,mtmp);
  }
  else {
    lVar15 = money_cnt(mtmp->minvent);
    lVar8 = lVar15;
    if (lVar14 < lVar15) {
      lVar8 = lVar14;
    }
    if (sell_response == '\0') {
      lVar10 = contained_cost(obj,mtmp,0,'\0','\0');
      lVar11 = contained_cost(obj,mtmp,0,'\0','\x01');
      pcVar7 = Monnam(mtmp);
      pcVar16 = " only";
      if (lVar14 <= lVar15) {
        pcVar16 = "";
      }
      pcVar12 = "s";
      if (lVar8 == 1) {
        pcVar12 = "";
      }
      pcVar17 = "the";
      if ((obj->field_0x4a & 4) == 0) {
        pcVar17 = "your";
      }
      pcVar13 = cxname(obj);
      bVar23 = lVar10 == lVar11;
      pcVar20 = " your items in";
      if (bVar23) {
        pcVar20 = " the contents of";
      }
      pcVar19 = "them";
      if (bVar23) {
        pcVar19 = "it";
      }
      pcVar22 = "You sold some items inside %s for %ld gold pieces%s.%s";
      if (bVar23) {
        pcVar22 = "You sold %s for %ld gold piece%s.%s";
      }
      if (lVar9 != 0 || local_168 == 0) {
        pcVar20 = "";
        pcVar19 = "it";
      }
      if (obj->quan != 1) {
        pcVar19 = "them";
      }
      sprintf(qbuf,"%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",pcVar7,pcVar16,lVar8,
              pcVar12,pcVar20,pcVar17,pcVar13,pcVar19);
    }
    else {
      qbuf[0] = '\0';
      pcVar22 = "You sold %s for %ld gold piece%s.%s";
    }
    uVar6 = (uint)(byte)sell_response;
    if (uVar6 == 0) {
      cVar4 = yn_function(qbuf,"ynaq",'y');
      uVar6 = (uint)cVar4;
    }
    if ((int)uVar6 < 0x71) {
      if (uVar6 != 0x61) {
        if (uVar6 != 0x6e) {
LAB_0023e855:
          warning("invalid sell response");
          return;
        }
        goto LAB_0023e8ce;
      }
      sell_response = 'y';
    }
    else if (uVar6 != 0x79) {
      if (uVar6 != 0x71) goto LAB_0023e855;
      goto LAB_0023e8c7;
    }
    if (poVar2 != (obj *)0x0) {
      dropped_container(obj,mtmp,'\x01');
    }
    if ((char)((*(uint *)&obj->field_0x4a & 4) >> 2) == '\0' && bVar3 == '\0') {
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a | 8;
    }
    subfrombill(obj,mtmp);
    pay(-lVar8,mtmp);
    if (local_168 == 0) {
      pcVar22 = "You sold %s for %ld gold piece%s.%s";
    }
    if (lVar9 != 0) {
      pcVar22 = "You sold %s for %ld gold piece%s.%s";
    }
    pcVar7 = "You relinquish %s and receive %ld gold piece%s in compensation.%s";
    if (sell_how != 0) {
      pcVar7 = pcVar22;
    }
    shk_names_obj(mtmp,obj,pcVar7,lVar8,"");
  }
  return;
}

Assistant:

void sellobj(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;
	struct eshk *eshkp;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L, offer;
	boolean saleitem, cgold = FALSE, container = Has_contents(obj);
	boolean isgold = (obj->oclass == COIN_CLASS);
	boolean only_partially_your_contents = FALSE;

	if (!(shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) ||
	   !inhishop(shkp)) return;
	if (!costly_spot(x, y))	return;
	if (!*u.ushops) return;

	if (obj->unpaid && !container && !isgold) {
	    sub_one_frombill(obj, shkp);
	    return;
	}
	if (container) {
		/* find the price of content before subfrombill */
		cltmp += contained_cost(obj, shkp, cltmp, TRUE, FALSE);
		/* find the value of contained gold */
		gltmp += contained_gold(obj);
		cgold = (gltmp > 0L);
	}

	saleitem = saleable(shkp, obj);
	if (!isgold && !obj->unpaid && saleitem)
	    ltmp = set_cost(obj, shkp);

	offer = ltmp + cltmp;

	/* get one case out of the way: nothing to sell, and no gold */
	if (!(isgold || cgold) &&
	   ((offer + gltmp) == 0L || sell_how == SELL_DONTSELL)) {
		boolean unpaid = (obj->unpaid ||
				  (container && count_unpaid(obj->cobj)));

		if (container) {
			dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid)
			    obj->no_charge = 1;
			if (obj->unpaid || count_unpaid(obj->cobj))
			    subfrombill(obj, shkp);
		} else obj->no_charge = 1;

		if (!unpaid && (sell_how != SELL_DONTSELL))
		    pline("%s seems uninterested.", Monnam(shkp));
		return;
	}

	/* you dropped something of your own - probably want to sell it */
	rouse_shk(shkp, TRUE);	/* wake up sleeping or paralyzed shk */
	eshkp = ESHK(shkp);

	if (ANGRY(shkp)) { /* they become shop-objects, no pay */
		pline("Thank you, scum!");
		subfrombill(obj, shkp);
		return;
	}

	if (eshkp->robbed) {  /* shkp is not angry? */
		if (isgold) offer = obj->quan;
		else if (cgold) offer += cgold;
		if ((eshkp->robbed -= offer < 0L))
			eshkp->robbed = 0L;
		if (offer) verbalize(
  "Thank you for your contribution to restock this recently plundered shop.");
		subfrombill(obj, shkp);
		return;
	}

	if (isgold || cgold) {
		if (!cgold) gltmp = obj->quan;

		if (eshkp->debit >= gltmp) {
		    if (eshkp->loan) { /* you carry shop's gold */
			 if (eshkp->loan >= gltmp)
			     eshkp->loan -= gltmp;
			 else eshkp->loan = 0L;
		    }
		    eshkp->debit -= gltmp;
		    pline("Your debt is %spaid off.",
				eshkp->debit ? "partially " : "");
		} else {
		    long delta = gltmp - eshkp->debit;

		    eshkp->credit += delta;
		    if (eshkp->debit) {
			eshkp->debit = 0L;
			eshkp->loan = 0L;
			pline("Your debt is paid off.");
		    }
		    pline("%ld %s %s added to your credit.",
				delta, currency(delta), delta > 1L ? "are" : "is");
		}
		if (offer && sell_how != SELL_DONTSELL) {
		    goto move_on;
		} else {
		    if (!isgold) {
			if (container)
			    dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid) obj->no_charge = 1;
			subfrombill(obj, shkp);
		    }
		    return;
		}
	}
move_on:
	if ((!saleitem && !(container && cltmp > 0L))
	   || eshkp->billct == BILLSZ
	   || obj->oclass == BALL_CLASS
	   || obj->oclass == CHAIN_CLASS || offer == 0L
	   || (obj->oclass == FOOD_CLASS && obj->oeaten)
	   || (Is_candle(obj) &&
		   obj->age < 20L * (long)objects[obj->otyp].oc_cost)) {
		pline("%s seems uninterested%s.", Monnam(shkp),
			cgold ? " in the rest" : "");
		if (container)
		    dropped_container(obj, shkp, FALSE);
		obj->no_charge = 1;
		return;
	}
        
	if (!money_cnt(shkp->minvent)) {
		char c, qbuf[BUFSZ];
		long tmpcr = ((offer * 9L) / 10L) + (offer <= 1L);

		if (sell_how == SELL_NORMAL || auto_credit) {
		    c = sell_response = 'y';
		} else if (sell_response != 'n') {
		    pline("%s cannot pay you at present.", Monnam(shkp));
		    sprintf(qbuf,
			    "Will you accept %ld %s in credit for %s?",
			    tmpcr, currency(tmpcr), doname(obj));
		    /* won't accept 'a' response here */
		    /* KLY - 3/2000 yes, we will, it's a damn nuisance
                       to have to constantly hit 'y' to sell for credit */
		    c = ynaq(qbuf);
		    if (c == 'a') {
			c = 'y';
			auto_credit = TRUE;
		    }
		} else		/* previously specified "quit" */
		    c = 'n';

		if (c == 'y') {
		    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
			    "You traded %s for %ld zorkmid%s in %scredit." :
			"You relinquish %s and acquire %ld zorkmid%s in %scredit.",
			    tmpcr,
			    (eshkp->credit > 0L) ? "additional " : "");
		    eshkp->credit += tmpcr;
		    subfrombill(obj, shkp);
		} else {
		    if (c == 'q') sell_response = 'n';
		    if (container)
			dropped_container(obj, shkp, FALSE);
		    if (!obj->unpaid) obj->no_charge = 1;
		    subfrombill(obj, shkp);
		}
	} else {
		char qbuf[BUFSZ];
                long shkmoney = money_cnt(shkp->minvent);
		boolean short_funds = (offer > shkmoney);
		if (short_funds) offer = shkmoney;
		if (!sell_response) {
		    only_partially_your_contents =
			(contained_cost(obj, shkp, 0L, FALSE, FALSE) !=
			 contained_cost(obj, shkp, 0L, FALSE, TRUE));
		    sprintf(qbuf,
			 "%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",
			    Monnam(shkp), short_funds ? " only" : "",
			    offer, plur(offer),
			    (!ltmp && cltmp && only_partially_your_contents) ?
			     " your items in" : (!ltmp && cltmp) ? " the contents of" : "",
			    obj->unpaid ? "the" : "your", cxname(obj),
			    (obj->quan == 1L &&
			    !(!ltmp && cltmp && only_partially_your_contents)) ?
			    "it" : "them");
		} else  qbuf[0] = '\0';		/* just to pacify lint */

		switch (sell_response ? sell_response : ynaq(qbuf)) {
		 case 'q':  sell_response = 'n';
		 case 'n':  if (container)
				dropped_container(obj, shkp, FALSE);
			    if (!obj->unpaid) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    break;
		 case 'a':  sell_response = 'y';
		 case 'y':  if (container)
				dropped_container(obj, shkp, TRUE);
			    if (!obj->unpaid && !saleitem) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    pay(-offer, shkp);
			    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
				    (!ltmp && cltmp && only_partially_your_contents) ?
			    	    "You sold some items inside %s for %ld gold pieces%s.%s" :
				    "You sold %s for %ld gold piece%s.%s" :
	       "You relinquish %s and receive %ld gold piece%s in compensation.%s",
				    offer, "");
			    break;
		 default:   warning("invalid sell response");
		}
	}
}